

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this,string *pfile,string *home)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  pointer ppVar10;
  undefined8 *puVar11;
  mapped_type *pmVar12;
  RuleHash hash;
  undefined1 local_2f0 [8];
  string fpath;
  string local_2c8;
  _Self local_2a8;
  _Self local_2a0;
  iterator rhi;
  undefined1 local_278 [8];
  string fname;
  string line;
  undefined1 local_228 [8];
  ifstream fin;
  string *home_local;
  string *pfile_local;
  cmGlobalGenerator *this_local;
  
  pcVar8 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar8,_S_in);
  bVar5 = std::ios::operator!((ios *)(local_228 + (long)*(_func_int **)((long)local_228 + -0x18)));
  if ((bVar5 & 1) == 0) {
    std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_278);
    while (bVar6 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_228,(string *)((long)&fname.field_2 + 8),(bool *)0x0,
                              0xffffffffffffffff), bVar6) {
      uVar9 = std::__cxx11::string::size();
      if ((0x21 < uVar9) &&
         (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)((long)&fname.field_2 + 8)),
         *pcVar8 != '#')) {
        std::__cxx11::string::substr((ulong)&rhi,(ulong)((long)&fname.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_278,(string *)&rhi);
        std::__cxx11::string::~string((string *)&rhi);
        local_2a0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::find(&this->RuleHashes,(key_type *)local_278);
        local_2a8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::end(&this->RuleHashes);
        bVar6 = std::operator!=(&local_2a0,&local_2a8);
        if (bVar6) {
          pcVar8 = (char *)std::__cxx11::string::c_str();
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>
                    ::operator->(&local_2a0);
          iVar7 = strncmp(pcVar8,(ppVar10->second).Data,0x20);
          if (iVar7 != 0) {
            cmsys::SystemTools::CollapseFullPath(&local_2c8,(string *)local_278,home);
            std::__cxx11::string::operator=((string *)local_278,(string *)&local_2c8);
            std::__cxx11::string::~string((string *)&local_2c8);
            fpath.field_2._8_8_ = cmsys::SystemTools::RemoveFile((string *)local_278);
          }
        }
        else {
          cmsys::SystemTools::CollapseFullPath((string *)local_2f0,(string *)local_278,home);
          bVar6 = cmsys::SystemTools::FileExists((string *)local_2f0);
          if (bVar6) {
            puVar11 = (undefined8 *)std::__cxx11::string::c_str();
            uVar1 = *puVar11;
            uVar2 = puVar11[1];
            uVar3 = puVar11[2];
            uVar4 = puVar11[3];
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
                      ::operator[](&this->RuleHashes,(key_type *)local_278);
            *(undefined8 *)pmVar12->Data = uVar1;
            *(undefined8 *)(pmVar12->Data + 8) = uVar2;
            *(undefined8 *)(pmVar12->Data + 0x10) = uVar3;
            *(undefined8 *)(pmVar12->Data + 0x18) = uVar4;
          }
          std::__cxx11::string::~string((string *)local_2f0);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes(std::string const& pfile,
                                        std::string const& home)
{
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(pfile.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(pfile.c_str());
#endif
  if (!fin) {
    return;
  }
  std::string line;
  std::string fname;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Line format is a 32-byte hex string followed by a space
    // followed by a file name (with no escaping).

    // Skip blank and comment lines.
    if (line.size() < 34 || line[0] == '#') {
      continue;
    }

    // Get the filename.
    fname = line.substr(33);

    // Look for a hash for this file's rule.
    auto const rhi = this->RuleHashes.find(fname);
    if (rhi != this->RuleHashes.end()) {
      // Compare the rule hash in the file to that we were given.
      if (strncmp(line.c_str(), rhi->second.Data, 32) != 0) {
        // The rule has changed.  Delete the output so it will be
        // built again.
        fname = cmSystemTools::CollapseFullPath(fname, home);
        cmSystemTools::RemoveFile(fname);
      }
    } else {
      // We have no hash for a rule previously listed.  This may be a
      // case where a user has turned off a build option and might
      // want to turn it back on later, so do not delete the file.
      // Instead, we keep the rule hash as long as the file exists so
      // that if the feature is turned back on and the rule has
      // changed the file is still rebuilt.
      std::string fpath = cmSystemTools::CollapseFullPath(fname, home);
      if (cmSystemTools::FileExists(fpath)) {
        RuleHash hash;
        memcpy(hash.Data, line.c_str(), 32);
        this->RuleHashes[fname] = hash;
      }
    }
  }
}